

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O2

void __thiscall
Eigen::internal::CompressedStorage<float,_int>::reallocate
          (CompressedStorage<float,_int> *this,Index size)

{
  Scalar *pSVar1;
  StorageIndex *pSVar2;
  IntPtr size_1;
  long lVar3;
  scoped_array<float> newValues;
  scoped_array<int> newIndices;
  scoped_array<float> local_28;
  scoped_array<int> local_20;
  
  scoped_array<float>::scoped_array(&local_28,size);
  scoped_array<int>::scoped_array(&local_20,size);
  lVar3 = this->m_size;
  if (size <= this->m_size) {
    lVar3 = size;
  }
  if (0 < lVar3) {
    memcpy(local_28.m_ptr,this->m_values,lVar3 << 2);
    memcpy(local_20.m_ptr,this->m_indices,lVar3 << 2);
  }
  pSVar1 = this->m_values;
  this->m_values = local_28.m_ptr;
  pSVar2 = this->m_indices;
  this->m_indices = local_20.m_ptr;
  this->m_allocatedSize = size;
  local_28.m_ptr = pSVar1;
  local_20.m_ptr = pSVar2;
  scoped_array<int>::~scoped_array(&local_20);
  scoped_array<float>::~scoped_array(&local_28);
  return;
}

Assistant:

inline void reallocate(Index size)
    {
      #ifdef EIGEN_SPARSE_COMPRESSED_STORAGE_REALLOCATE_PLUGIN
        EIGEN_SPARSE_COMPRESSED_STORAGE_REALLOCATE_PLUGIN
      #endif
      eigen_internal_assert(size!=m_allocatedSize);
      internal::scoped_array<Scalar> newValues(size);
      internal::scoped_array<StorageIndex> newIndices(size);
      Index copySize = (std::min)(size, m_size);
      if (copySize>0) {
        internal::smart_copy(m_values, m_values+copySize, newValues.ptr());
        internal::smart_copy(m_indices, m_indices+copySize, newIndices.ptr());
      }
      std::swap(m_values,newValues.ptr());
      std::swap(m_indices,newIndices.ptr());
      m_allocatedSize = size;
    }